

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O0

string * OpenMD::UpperCase(string *S)

{
  char cVar1;
  uint uVar2;
  char *pcVar3;
  string *in_RSI;
  string *in_RDI;
  char sj;
  uint j;
  uint n;
  string *uc;
  undefined4 local_1c;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  uVar2 = std::__cxx11::string::size();
  for (local_1c = 0; local_1c < uVar2; local_1c = local_1c + 1) {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
    cVar1 = *pcVar3;
    if (('`' < cVar1) && (cVar1 < '{')) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
      *pcVar3 = cVar1 + -0x20;
    }
  }
  return in_RDI;
}

Assistant:

std::string UpperCase(const std::string& S) {
    std::string uc = S;
    unsigned int n = uc.size();
    for (unsigned int j = 0; j < n; j++) {
      char sj = uc[j];
      if (sj >= 'a' && sj <= 'z') uc[j] = (char)(sj - ('a' - 'A'));
    }
    return uc;
  }